

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void idx2::CallocBuf(buffer *Buf,i64 Bytes,allocator *Alloc)

{
  byte *pbVar1;
  printer Pr;
  
  Mallocator();
  if (Alloc == &Mallocator::Instance.super_allocator) {
    pbVar1 = (byte *)calloc(Bytes,1);
    Buf->Data = pbVar1;
  }
  else {
    (**Alloc->_vptr_allocator)(Alloc,Buf,Bytes);
    memset(Buf->Data,0,Buf->Bytes);
    pbVar1 = Buf->Data;
  }
  if (pbVar1 != (byte *)0x0) {
    Buf->Bytes = Bytes;
    Buf->Alloc = Alloc;
    return;
  }
  fprintf(_stderr,"Condition \"%s\" failed, ","!(!(Buf->Data)) && \"Fatal error!\"");
  fprintf(_stderr,"in file %s, line %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.cpp"
          ,0x59);
  fwrite("Out of memory",0xd,1,_stderr);
  fputc(10,_stderr);
  printer::printer(&Pr,(FILE *)_stderr);
  PrintStacktrace(&Pr);
  exit(1);
}

Assistant:

void
CallocBuf(buffer* Buf, i64 Bytes, allocator* Alloc)
{
  idx2_Assert(!Buf->Data || Buf->Bytes == 0, "Buffer not freed before allocating new memory");
  if (Alloc == &Mallocator())
  {
    Buf->Data = (byte*)calloc(size_t(Bytes), 1);
  }
  else
  {
    AllocBuf(Buf, Bytes, Alloc);
    ZeroBuf(Buf);
  }
  idx2_AbortIf(!(Buf->Data), "Out of memory");
  Buf->Bytes = Bytes;
  Buf->Alloc = Alloc;
}